

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.cc
# Opt level: O0

void __thiscall pstack::Dwarf::CIE::CIE(CIE *this,CFI *fi,DWARFReader *r,Off end_)

{
  bool bVar1;
  DWARFReader *this_00;
  uint8_t uVar2;
  byte bVar3;
  bool bVar4;
  uintmax_t uVar5;
  intmax_t iVar6;
  reference pcVar7;
  string *psVar8;
  element_type *peVar9;
  ostream *poVar10;
  Off OVar11;
  pair<unsigned_long,_bool> pVar12;
  pair<unsigned_long,_bool> local_98;
  char local_81;
  iterator iStack_80;
  char aug;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  Off endaugdata;
  undefined1 local_58 [7];
  bool earlyExit;
  Off local_28;
  Off end__local;
  DWARFReader *r_local;
  CFI *fi_local;
  CIE *this_local;
  
  this->frameInfo = fi;
  this->addressEncoding = '\0';
  this->addressSize = '\b';
  this->segmentSize = '\0';
  this->lsdaEncoding = '\0';
  this->isSignalHandler = false;
  this->initial_instructions = 0;
  this->end = end_;
  local_28 = end_;
  end__local = (Off)r;
  r_local = (DWARFReader *)fi;
  fi_local = (CFI *)this;
  std::pair<unsigned_long,_bool>::pair<unsigned_long,_bool,_true>(&this->personality);
  std::__cxx11::string::string((string *)&this->augmentation);
  uVar2 = DWARFReader::getu8((DWARFReader *)end__local);
  this->version = uVar2;
  DWARFReader::getstring_abi_cxx11_((string *)local_58,(DWARFReader *)end__local);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->augmentation,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  std::__cxx11::string::~string((string *)local_58);
  if (3 < this->version) {
    uVar2 = DWARFReader::getu8((DWARFReader *)end__local);
    this->addressSize = uVar2;
    uVar2 = DWARFReader::getu8((DWARFReader *)end__local);
    this->segmentSize = uVar2;
  }
  uVar5 = DWARFReader::getuleb128((DWARFReader *)end__local);
  this->codeAlign = (uint)uVar5;
  iVar6 = DWARFReader::getsleb128((DWARFReader *)end__local);
  this->dataAlign = (int)iVar6;
  bVar3 = DWARFReader::getu8((DWARFReader *)end__local);
  this->rar = (uint)bVar3;
  this->addressEncoding = '\x04';
  bVar1 = false;
  __range2 = (string *)DWARFReader::getOffset((DWARFReader *)end__local);
  __end2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                     (&this->augmentation);
  iStack_80 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                        (&this->augmentation);
  while (bVar4 = __gnu_cxx::
                 operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           (&__end2,&stack0xffffffffffffff80), ((bVar4 ^ 0xffU) & 1) != 0) {
    pcVar7 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end2);
    this_00 = r_local;
    OVar11 = end__local;
    local_81 = *pcVar7;
    if (local_81 != '\0') {
      if (local_81 == 'L') {
        uVar2 = DWARFReader::getu8((DWARFReader *)end__local);
        this->lsdaEncoding = uVar2;
      }
      else if (local_81 == 'P') {
        uVar2 = DWARFReader::getu8((DWARFReader *)end__local);
        pVar12 = CFI::decodeAddress((CFI *)this_00,(DWARFReader *)OVar11,uVar2,
                                    (uintptr_t)
                                    (r_local->io).
                                    super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi);
        local_98.first = pVar12.first;
        local_98.second = pVar12.second;
        std::pair<unsigned_long,_bool>::operator=(&this->personality,&local_98);
      }
      else if (local_81 == 'R') {
        uVar2 = DWARFReader::getu8((DWARFReader *)end__local);
        this->addressEncoding = uVar2;
      }
      else if (local_81 == 'S') {
        this->isSignalHandler = true;
      }
      else if (local_81 == 'z') {
        uVar5 = DWARFReader::getuleb128((DWARFReader *)end__local);
        OVar11 = DWARFReader::getOffset((DWARFReader *)end__local);
        __range2 = (string *)(OVar11 + uVar5);
      }
      else {
        peVar9 = std::
                 __shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&(((r_local->io).
                                    super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->super_enable_shared_from_this<pstack::Reader>).
                                  _M_weak_this.
                                  super___weak_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
        poVar10 = std::operator<<(peVar9->context->debug,"unknown augmentation \'");
        poVar10 = std::operator<<(poVar10,local_81);
        poVar10 = std::operator<<(poVar10,"\' in ");
        poVar10 = std::operator<<(poVar10,(string *)&this->augmentation);
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        bVar1 = true;
      }
    }
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  psVar8 = (string *)DWARFReader::getOffset((DWARFReader *)end__local);
  if (psVar8 != __range2) {
    peVar9 = std::__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(((r_local->io).
                                super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->super_enable_shared_from_this<pstack::Reader>)._M_weak_this
                              .super___weak_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
    poVar10 = std::operator<<(peVar9->context->debug,"warning: ");
    OVar11 = DWARFReader::getOffset((DWARFReader *)end__local);
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,(long)__range2 - OVar11);
    poVar10 = std::operator<<(poVar10," bytes of augmentation ignored");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    DWARFReader::setOffset((DWARFReader *)end__local,(Off)__range2);
  }
  OVar11 = DWARFReader::getOffset((DWARFReader *)end__local);
  this->initial_instructions = OVar11;
  return;
}

Assistant:

CIE::CIE(const CFI *fi, DWARFReader &r, Elf::Off end_)
    : frameInfo(fi)
    , addressEncoding(0)
    , addressSize(ELF_BYTES)
    , segmentSize(0)
    , lsdaEncoding(0)
    , isSignalHandler(false)
    , initial_instructions(0)
    , end(end_)
    , personality{}
{
    version = r.getu8();
    augmentation = r.getstring();
    if (version >= 4) {
        addressSize = r.getu8();
        segmentSize = r.getu8();
    }
    codeAlign = r.getuleb128();
    dataAlign = r.getsleb128();
    rar = r.getu8();

#if ELF_BITS == 32
    addressEncoding = DW_EH_PE_udata4;
#elif ELF_BITS == 64
    addressEncoding = DW_EH_PE_udata8;
#else
    #error "no default address encoding"
#endif

    bool earlyExit = false;
    Elf::Off endaugdata = r.getOffset();
    for (auto aug : augmentation) {
        switch (aug) {
            case 'z':
                endaugdata = r.getuleb128();
                endaugdata += r.getOffset();
                break;
            case 'P':
                personality = fi->decodeAddress(r, r.getu8(), fi->sectionAddr );
                break;
            case 'L':
                lsdaEncoding = r.getu8();
                break;
            case 'R':
                addressEncoding = r.getu8();
                break;
            case 'S':
                isSignalHandler = true;
                break;
            case '\0':
                break;
            default:
                *fi->dwarf->elf->context.debug << "unknown augmentation '" << aug << "' in " << augmentation << std::endl;
                // The augmentations are in order, so we can't make any sense
                // of the remaining data in the augmentation block
                earlyExit = true;
                break;
        }
        if (earlyExit)
            break;
    }
    if (r.getOffset() != endaugdata) {
        *fi->dwarf->elf->context.debug << "warning: " << endaugdata - r.getOffset() << " bytes of augmentation ignored" << std::endl;
        r.setOffset(endaugdata);
    }
    initial_instructions = r.getOffset();
}